

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O2

bool __thiscall
avro::BufferCopyInInputStream::next(BufferCopyInInputStream *this,uint8_t **data,size_t *size)

{
  uint8_t *puVar1;
  bool bVar2;
  size_t sVar3;
  
  sVar3 = this->available_;
  if (sVar3 == 0) {
    bVar2 = fill(this);
    if (!bVar2) {
      return false;
    }
    sVar3 = this->available_;
  }
  puVar1 = this->next_;
  *data = puVar1;
  *size = sVar3;
  this->next_ = puVar1 + this->available_;
  this->byteCount_ = this->byteCount_ + this->available_;
  this->available_ = 0;
  return true;
}

Assistant:

bool next(const uint8_t** data, size_t *size) {
        if (available_ == 0 && ! fill()) {
            return false;
        }
        *data = next_;
        *size = available_;
        next_ += available_;
        byteCount_ += available_;
        available_ = 0;
        return true;
    }